

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  int iVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar33;
  ulong uVar34;
  int iVar38;
  uint uVar39;
  uint uVar40;
  int iVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar41;
  ulong uVar42;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  __m128i vWH_00;
  int32_t in_stack_fffffffffffff328;
  int local_ccc;
  int local_cb8;
  int local_cb4;
  int local_ca0;
  int local_c9c;
  int local_c88;
  int local_c84;
  int local_c70;
  int local_c6c;
  longlong local_c58;
  longlong lStack_c50;
  int iStack_c3c;
  int local_c2c;
  int local_c28;
  int local_c24;
  longlong *plStack_c20;
  int32_t k;
  int32_t *j_1;
  int32_t *i_1;
  int32_t *u;
  int32_t *t;
  int32_t *s;
  int local_bf0;
  int32_t last_val;
  int32_t max_col;
  int32_t max_row;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastVal;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_608;
  int iStack_604;
  int iStack_600;
  int iStack_5fc;
  int local_5e8;
  int iStack_5e4;
  int iStack_5e0;
  int iStack_5dc;
  int local_5c8;
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int local_588;
  int iStack_584;
  int iStack_580;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c0;
  int iStack_1bc;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  
  s2B = (int32_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse41_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse41_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse41_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse41_128_32","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_c28 = _s1Len;
    if (matrix->type != 0) {
      local_c28 = matrix->length;
    }
    NEG_LIMIT = 0;
    POS_LIMIT = 0;
    if (-open < matrix->min) {
      local_c2c = open + -0x80000000;
    }
    else {
      local_c2c = -0x80000000 - matrix->min;
    }
    local_c2c = local_c2c + 1;
    iVar28 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(local_c2c,local_c2c);
    vSaturationCheckMax[0] = CONCAT44(local_c2c,local_c2c);
    vSaturationCheckMax[1] = CONCAT44(iVar28,iVar28);
    vSaturationCheckMin[0] = CONCAT44(iVar28,iVar28);
    uVar9 = CONCAT44(local_c2c,local_c2c);
    uVar10 = CONCAT44(local_c2c,local_c2c);
    if (s1_beg == 0) {
      iStack_c3c = gap * 4;
    }
    else {
      iStack_c3c = 0;
    }
    vJreset[1] = 0x200000003;
    vI[0] = 1;
    vMaxHRow[0] = uVar10;
    vMaxHCol[1] = uVar9;
    vMaxHCol[0] = uVar10;
    vLastVal[1] = uVar9;
    vLastVal[0] = uVar10;
    vEndI[1] = uVar9;
    vEndI[0] = uVar10;
    vEndJ[1] = uVar9;
    vEndJ[0] = uVar10;
    vILimit[1] = uVar9;
    vILimit[0] = CONCAT44(local_c28,local_c28);
    if (s1_beg == 0) {
      iVar29 = -open;
      local_c58 = CONCAT44(iVar29 + gap * -2,iVar29 + gap * -3);
      lStack_c50 = CONCAT44(iVar29,iVar29 - gap);
    }
    else {
      local_c58 = 0;
      lStack_c50 = 0;
    }
    vNH[1] = local_c58;
    vIBoundary[0] = lStack_c50;
    iVar29 = gap;
    _s1_local = (char *)parasail_result_new_table1(local_c28,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4401002;
      uVar31 = 0;
      if (s1_beg != 0) {
        uVar31 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar31 | ((parasail_result_t *)_s1_local)->flag;
      uVar31 = 0;
      if (s1_end != 0) {
        uVar31 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar31 | ((parasail_result_t *)_s1_local)->flag;
      uVar31 = 0;
      if (s2_beg != 0) {
        uVar31 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar31 | ((parasail_result_t *)_s1_local)->flag;
      uVar31 = 0;
      if (s2_end != 0) {
        uVar31 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar31 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_01 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int32_t(0x10,(long)(local_c28 + 3));
          if (s2B == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_c28; end_query = end_query + 1) {
            s2B[end_query] = matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_c28; end_query < local_c28 + 3; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr[(long)end_ref + 3] = 0;
          iVar1 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 3] = -(end_ref * gap) - open;
            ptr_01[(long)end_ref + 3] = local_c2c;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 3] = 0;
            ptr_01[(long)end_ref + 3] = local_c2c;
          }
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = local_c2c;
          ptr_01[(long)end_ref + 3] = local_c2c;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = local_c2c;
          ptr_01[(long)end_ref + 3] = local_c2c;
          iVar1 = end_ref + 1;
        }
        ptr_00[2] = 0;
        for (end_query = 0; end_query < local_c28; end_query = end_query + 4) {
          vNH[0] = uVar10;
          vWH[1] = uVar9;
          vWH[0] = uVar10;
          vE[1] = uVar9;
          vE[0] = uVar10;
          vF[1] = uVar9;
          vF[0] = uVar10;
          vJ[1] = uVar9;
          vJ[0] = 0xffffffff;
          piVar5 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_c6c = s2B[end_query];
          }
          else {
            if (end_query < local_c28) {
              local_c70 = end_query;
            }
            else {
              local_c70 = local_c28 + -1;
            }
            local_c6c = local_c70;
          }
          piVar6 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_c84 = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_c28) {
              local_c88 = end_query + 1;
            }
            else {
              local_c88 = local_c28 + -1;
            }
            local_c84 = local_c88;
          }
          piVar7 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_c9c = s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_c28) {
              local_ca0 = end_query + 2;
            }
            else {
              local_ca0 = local_c28 + -1;
            }
            local_c9c = local_ca0;
          }
          piVar8 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_cb4 = s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_c28) {
              local_cb8 = end_query + 3;
            }
            else {
              local_cb8 = local_c28 + -1;
            }
            local_cb4 = local_cb8;
          }
          iStack_1c0 = (int)vILimit[0];
          iStack_1bc = (int)((ulong)vILimit[0] >> 0x20);
          local_1d8 = (int)vJreset[1];
          iStack_1d4 = (int)((ulong)vJreset[1] >> 0x20);
          iStack_1d0 = (int)vI[0];
          iStack_1cc = (int)((ulong)vI[0] >> 0x20);
          iVar30 = -(uint)(local_1d8 == local_c28 + -1);
          iVar35 = -(uint)(iStack_1d4 == local_c28 + -1);
          iVar38 = -(uint)(iStack_1d0 == local_c28 + -1);
          iVar43 = -(uint)(iStack_1cc == local_c28 + -1);
          stack0xfffffffffffff568 = vWH._12_12_;
          vNH[0]._4_4_ = ptr_00[2];
          vE[1] = vE._12_8_;
          if (s1_beg == 0) {
            local_ccc = -(end_query * gap) - open;
          }
          else {
            local_ccc = 0;
          }
          vWH[0]._4_4_ = local_ccc;
          vWH[0]._0_4_ = local_c2c;
          ptr_00[2] = -((end_query + 4) * gap) - open;
          matrow0 = (int *)0xfffffffefffffffd;
          for (end_ref = 0; auVar18 = stack0xfffffffffffff568, end_ref < s2Len + 3;
              end_ref = end_ref + 1) {
            stack0xfffffffffffff568 = vE._12_12_;
            vNH[0]._4_4_ = ptr_00[(long)end_ref + 3];
            local_588 = vE[1]._4_4_;
            iStack_584 = (int)vE[2];
            iStack_580 = vE[2]._4_4_;
            iVar47 = local_588 - open;
            iVar48 = iStack_584 - open;
            iVar49 = iStack_580 - open;
            iVar50 = ptr_00[(long)end_ref + 3] - open;
            local_5a8 = vJ[1]._4_4_;
            iStack_5a4 = (int)vJ[2];
            iStack_5a0 = vJ[2]._4_4_;
            local_5a8 = local_5a8 - gap;
            iStack_5a4 = iStack_5a4 - gap;
            iStack_5a0 = iStack_5a0 - gap;
            iVar44 = ptr_01[(long)end_ref + 3] - gap;
            uVar31 = (uint)(iVar47 < local_5a8) * local_5a8 | (uint)(iVar47 >= local_5a8) * iVar47;
            uVar36 = (uint)(iVar48 < iStack_5a4) * iStack_5a4 |
                     (uint)(iVar48 >= iStack_5a4) * iVar48;
            uVar39 = (uint)(iVar49 < iStack_5a0) * iStack_5a0 |
                     (uint)(iVar49 >= iStack_5a0) * iVar49;
            uVar45 = (uint)(iVar50 < iVar44) * iVar44 | (uint)(iVar50 >= iVar44) * iVar50;
            vJ[1] = CONCAT44(uVar36,uVar31);
            vF[0]._0_4_ = uVar39;
            vF[0]._4_4_ = uVar45;
            local_5c8 = (int)vE[1];
            local_5c8 = local_5c8 - open;
            local_588 = local_588 - open;
            iStack_584 = iStack_584 - open;
            iStack_580 = iStack_580 - open;
            local_5e8 = (int)vF[1];
            iStack_5e4 = vF[1]._4_4_;
            iStack_5e0 = (int)vF[2];
            iStack_5dc = vF[2]._4_4_;
            local_5e8 = local_5e8 - gap;
            iStack_5e4 = iStack_5e4 - gap;
            iStack_5e0 = iStack_5e0 - gap;
            iStack_5dc = iStack_5dc - gap;
            uVar32 = (uint)(local_5c8 < local_5e8) * local_5e8 |
                     (uint)(local_5c8 >= local_5e8) * local_5c8;
            uVar37 = (uint)(local_588 < iStack_5e4) * iStack_5e4 |
                     (uint)(local_588 >= iStack_5e4) * local_588;
            uVar40 = (uint)(iStack_584 < iStack_5e0) * iStack_5e0 |
                     (uint)(iStack_584 >= iStack_5e0) * iStack_584;
            uVar46 = (uint)(iStack_580 < iStack_5dc) * iStack_5dc |
                     (uint)(iStack_580 >= iStack_5dc) * iStack_580;
            vF[1] = CONCAT44(uVar37,uVar32);
            vE[0]._0_4_ = uVar40;
            vE[0]._4_4_ = uVar46;
            local_388 = auVar18._0_4_;
            iStack_384 = auVar18._4_4_;
            iStack_380 = auVar18._8_4_;
            iStack_37c = auVar18._12_4_;
            local_388 = local_388 +
                        piVar8[(long)(iVar4 * local_cb4) + (long)ptr[(long)(end_ref + -3) + 3]];
            iStack_384 = iStack_384 +
                         piVar7[(long)(iVar3 * local_c9c) + (long)ptr[(long)(end_ref + -2) + 3]];
            iStack_380 = iStack_380 +
                         piVar6[(long)(iVar2 * local_c84) + (long)ptr[(long)(end_ref + -1) + 3]];
            iStack_37c = iStack_37c +
                         piVar5[(long)(iVar1 * local_c6c) + (long)ptr[(long)end_ref + 3]];
            uVar32 = (local_388 < (int)uVar32) * uVar32 |
                     (uint)(local_388 >= (int)uVar32) * local_388;
            uVar37 = (iStack_384 < (int)uVar37) * uVar37 |
                     (uint)(iStack_384 >= (int)uVar37) * iStack_384;
            uVar40 = (iStack_380 < (int)uVar40) * uVar40 |
                     (uint)(iStack_380 >= (int)uVar40) * iStack_380;
            uVar46 = (iStack_37c < (int)uVar46) * uVar46 |
                     (uint)(iStack_37c >= (int)uVar46) * iStack_37c;
            vE[1] = CONCAT44(((int)uVar37 < (int)uVar36) * uVar36 |
                             ((int)uVar37 >= (int)uVar36) * uVar37,
                             ((int)uVar32 < (int)uVar31) * uVar31 |
                             ((int)uVar32 >= (int)uVar31) * uVar32);
            vWH[0]._0_4_ = ((int)uVar40 < (int)uVar39) * uVar39 |
                           ((int)uVar40 >= (int)uVar39) * uVar40;
            vWH[0]._4_4_ = ((int)uVar46 < (int)uVar45) * uVar45 |
                           ((int)uVar46 >= (int)uVar45) * uVar46;
            local_4a8 = (int)matrow0;
            iStack_4a4 = (int)((ulong)matrow0 >> 0x20);
            iStack_4a0 = (int)vJ[0];
            iStack_49c = (int)((ulong)vJ[0] >> 0x20);
            iVar44 = -(uint)(local_4a8 == -1);
            iVar47 = -(uint)(iStack_4a4 == -1);
            iVar48 = -(uint)(iStack_4a0 == -1);
            iVar49 = -(uint)(iStack_49c == -1);
            auVar24._4_4_ = iVar47;
            auVar24._0_4_ = iVar44;
            auVar24._12_4_ = iVar49;
            auVar24._8_4_ = iVar48;
            auVar26._8_8_ = vWH[0];
            auVar26._0_8_ = vE[1];
            auVar25._8_8_ = vIBoundary[0];
            auVar25._0_8_ = vNH[1];
            register0x00001240 = pblendvb(auVar26,auVar25,auVar24);
            auVar21._4_4_ = iVar47;
            auVar21._0_4_ = iVar44;
            auVar21._12_4_ = iVar49;
            auVar21._8_4_ = iVar48;
            auVar23._8_8_ = vF[0];
            auVar23._0_8_ = vJ[1];
            auVar22._8_8_ = uVar10;
            auVar22._0_8_ = uVar9;
            register0x00001240 = pblendvb(auVar23,auVar22,auVar21);
            auVar18._4_4_ = iVar47;
            auVar18._0_4_ = iVar44;
            auVar18._12_4_ = iVar49;
            auVar18._8_4_ = iVar48;
            auVar20._8_8_ = vE[0];
            auVar20._0_8_ = vF[1];
            auVar19._8_8_ = uVar10;
            auVar19._0_8_ = uVar9;
            register0x00001240 = pblendvb(auVar20,auVar19,auVar18);
            iStack_1f4 = vE[1]._4_4_;
            iStack_1ec = vE[2]._4_4_;
            iStack_1f0 = (int)vE[2];
            if (3 < end_ref) {
              local_1e8 = (int)vSaturationCheckMax[1];
              iStack_1e4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_1e0 = (int)vSaturationCheckMin[0];
              iStack_1dc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44((uint)(iStack_1f4 < iStack_1e4) * iStack_1f4 |
                            (uint)(iStack_1f4 >= iStack_1e4) * iStack_1e4,
                            (uint)((int)vE[1] < local_1e8) * (int)vE[1] |
                            (uint)((int)vE[1] >= local_1e8) * local_1e8);
              vSaturationCheckMin[0] =
                   CONCAT44((uint)(iStack_1ec < iStack_1dc) * iStack_1ec |
                            (uint)(iStack_1ec >= iStack_1dc) * iStack_1dc,
                            (uint)(iStack_1f0 < iStack_1e0) * iStack_1f0 |
                            (uint)(iStack_1f0 >= iStack_1e0) * iStack_1e0);
              local_468 = (int)vNegInf[1];
              iStack_464 = (int)((ulong)vNegInf[1] >> 0x20);
              iStack_460 = (int)vSaturationCheckMax[0];
              iStack_45c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              vNegInf[1] = CONCAT44((uint)(iStack_464 < iStack_1f4) * iStack_1f4 |
                                    (uint)(iStack_464 >= iStack_1f4) * iStack_464,
                                    (uint)(local_468 < (int)vE[1]) * (int)vE[1] |
                                    (uint)(local_468 >= (int)vE[1]) * local_468);
              vSaturationCheckMax[0] =
                   CONCAT44((uint)(iStack_45c < iStack_1ec) * iStack_1ec |
                            (uint)(iStack_45c >= iStack_1ec) * iStack_45c,
                            (uint)(iStack_460 < iStack_1f0) * iStack_1f0 |
                            (uint)(iStack_460 >= iStack_1f0) * iStack_460);
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_c28;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,vWH_00,
                            end_ref,s2Len,iVar29,in_stack_fffffffffffff328);
            ptr_00[(long)(end_ref + -3) + 3] = (int)vE[1];
            ptr_01[(long)(end_ref + -3) + 3] = (int32_t)vJ[1];
            iVar44 = -(uint)(local_4a8 == s2Len + -1);
            iVar47 = -(uint)(iStack_4a4 == s2Len + -1);
            iVar48 = -(uint)(iStack_4a0 == s2Len + -1);
            iVar49 = -(uint)(iStack_49c == s2Len + -1);
            local_138 = (int)vMaxHCol[1];
            iStack_134 = vMaxHCol[1]._4_4_;
            iStack_130 = (int)vMaxHCol[2];
            iStack_12c = vMaxHCol[2]._4_4_;
            local_158 = (int)vLastVal[1];
            iStack_154 = vLastVal[1]._4_4_;
            iStack_150 = (int)vLastVal[2];
            iStack_14c = vLastVal[2]._4_4_;
            uVar33 = CONCAT44(-(uint)(iStack_134 < iStack_1f4),-(uint)(local_138 < (int)vE[1])) &
                     CONCAT44(iVar35,iVar30) &
                     CONCAT44(-(uint)(-1 < (long)matrow0),-(uint)(-1 < local_4a8)) &
                     CONCAT44(-(uint)(iStack_4a4 < s2Len),-(uint)(local_4a8 < s2Len));
            uVar41 = CONCAT44(-(uint)(iStack_12c < iStack_1ec),-(uint)(iStack_130 < iStack_1f0)) &
                     CONCAT44(iVar43,iVar38) &
                     CONCAT44(-(uint)(-1 < vJ[0]),-(uint)(-1 < iStack_4a0)) &
                     CONCAT44(-(uint)(iStack_49c < s2Len),-(uint)(iStack_4a0 < s2Len));
            uVar34 = CONCAT44(-(uint)(iStack_154 < iStack_1f4),-(uint)(local_158 < (int)vE[1])) &
                     CONCAT44(-(uint)(iStack_1d4 < local_c28),-(uint)(local_1d8 < local_c28)) &
                     CONCAT44(iVar47,iVar44);
            uVar42 = CONCAT44(-(uint)(iStack_14c < iStack_1ec),-(uint)(iStack_150 < iStack_1f0)) &
                     CONCAT44(-(uint)(iStack_1cc < iStack_1bc),-(uint)(iStack_1d0 < iStack_1c0)) &
                     CONCAT44(iVar49,iVar48);
            auVar17._8_8_ = uVar41;
            auVar17._0_8_ = uVar33;
            register0x00001240 = pblendvb(stack0xfffffffffffff608,register0x00001240,auVar17);
            auVar16._8_8_ = uVar42;
            auVar16._0_8_ = uVar34;
            register0x00001240 = pblendvb(stack0xfffffffffffff5f8,register0x00001240,auVar16);
            auVar15._8_8_ = CONCAT44(iVar43,iVar38) & CONCAT44(iVar49,iVar48);
            auVar15._0_8_ = CONCAT44(iVar35,iVar30) & CONCAT44(iVar47,iVar44);
            register0x00001240 = pblendvb(stack0xfffffffffffff5e8,register0x00001240,auVar15);
            auVar14._8_8_ = vI[0];
            auVar14._0_8_ = vJreset[1];
            auVar13._8_8_ = uVar42;
            auVar13._0_8_ = uVar34;
            register0x00001240 = pblendvb(stack0xfffffffffffff5d8,auVar14,auVar13);
            auVar12._8_8_ = vJ[0];
            auVar12._0_8_ = matrow0;
            auVar11._8_8_ = uVar41;
            auVar11._0_8_ = uVar33;
            register0x00001240 = pblendvb(stack0xfffffffffffff5c8,auVar12,auVar11);
            matrow0 = (int *)CONCAT44(iStack_4a4 + 1,local_4a8 + 1);
            vJ[0] = CONCAT44(iStack_49c + 1,iStack_4a0 + 1);
          }
          vJreset[1] = CONCAT44(iStack_1d4 + 4,local_1d8 + 4);
          vI[0] = CONCAT44(iStack_1cc + 4,iStack_1d0 + 4);
          local_608 = (int)vNH[1];
          iStack_604 = (int)((ulong)vNH[1] >> 0x20);
          iStack_600 = (int)vIBoundary[0];
          iStack_5fc = (int)((ulong)vIBoundary[0] >> 0x20);
          vNH[1] = CONCAT44(iStack_604 - iStack_c3c,local_608 - iStack_c3c);
          vIBoundary[0] = CONCAT44(iStack_5fc - iStack_c3c,iStack_600 - iStack_c3c);
        }
        t = (int32_t *)(vMaxHCol + 1);
        u = (int32_t *)(vLastVal + 1);
        i_1 = (int32_t *)(vEndI + 1);
        j_1 = (int32_t *)(vEndJ + 1);
        plStack_c20 = vILimit + 1;
        s._4_4_ = local_c2c;
        local_bf0 = local_c2c;
        last_val = local_c2c;
        for (local_c24 = 0; local_c24 < 4; local_c24 = local_c24 + 1) {
          if ((local_bf0 < *u) || ((*u == local_bf0 && (*j_1 < NEG_LIMIT)))) {
            local_bf0 = *u;
            NEG_LIMIT = *j_1;
          }
          if (last_val < *t) {
            last_val = *t;
            POS_LIMIT = (int32_t)*plStack_c20;
          }
          if (s._4_4_ < *i_1) {
            s._4_4_ = *i_1;
          }
          t = t + 1;
          u = u + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_c20 = (longlong *)((long)plStack_c20 + 4);
        }
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              vNegLimit[1]._4_4_ = s._4_4_;
              POS_LIMIT = s2Len + -1;
            }
            else {
              vNegLimit[1]._4_4_ = last_val;
            }
            NEG_LIMIT = local_c28 + -1;
          }
          else {
            vNegLimit[1]._4_4_ = local_bf0;
            POS_LIMIT = s2Len + -1;
          }
        }
        else if ((last_val < local_bf0) || ((local_bf0 == last_val && (POS_LIMIT == s2Len + -1)))) {
          vNegLimit[1]._4_4_ = local_bf0;
          POS_LIMIT = s2Len + -1;
        }
        else {
          vNegLimit[1]._4_4_ = last_val;
          NEG_LIMIT = local_c28 + -1;
        }
        local_198 = (int)vSaturationCheckMax[1];
        iStack_194 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_190 = (int)vSaturationCheckMin[0];
        iStack_18c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_168 = (int)vNegInf[1];
        iStack_164 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_160 = (int)vSaturationCheckMax[0];
        iStack_15c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar33 = CONCAT44(-(uint)(iStack_18c < local_c2c),-(uint)(iStack_190 < local_c2c)) |
                 CONCAT44(-(uint)(iVar28 < iStack_15c),-(uint)(iVar28 < iStack_160));
        auVar27._8_8_ = uVar33;
        auVar27._0_8_ =
             CONCAT44(-(uint)(iStack_194 < local_c2c),-(uint)(local_198 < local_c2c)) |
             CONCAT44(-(uint)(iVar28 < iStack_164),-(uint)(iVar28 < local_168));
        if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar33 >> 7 & 1) != 0) || (uVar33 >> 0xf & 1) != 0) || (uVar33 >> 0x17 & 1) != 0)
               || (uVar33 >> 0x1f & 1) != 0) || (uVar33 >> 0x27 & 1) != 0) ||
             (uVar33 >> 0x2f & 1) != 0) || (uVar33 >> 0x37 & 1) != 0) || (long)uVar33 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._4_4_ = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = vNegLimit[1]._4_4_;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}